

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1e8ba::CpuTest_brk_Test::CpuTest_brk_Test(CpuTest_brk_Test *this)

{
  CpuTest_brk_Test *this_local;
  
  n_e_s::core::test::CpuTest::CpuTest(&this->super_CpuTest);
  (this->super_CpuTest).super_Test._vptr_Test = (_func_int **)&PTR__CpuTest_brk_Test_003e70d0;
  return;
}

Assistant:

TEST_F(CpuTest, brk) {
    registers.pc = 0x1234;
    stage_instruction(BRK);
    expected.pc = 0xDEAD;

    expected.sp -= 2 + 1; // 1 word and 1 byte

    // Dummy read
    EXPECT_CALL(mmu, read_byte(0x1235));

    // First the return address is pushed and then the registers.
    EXPECT_CALL(mmu, write_byte(kStackOffset + registers.sp, 0x12));
    EXPECT_CALL(mmu, write_byte(kStackOffset + registers.sp - 1, 0x36));
    EXPECT_CALL(mmu,
            write_byte(kStackOffset + registers.sp - 2, registers.p | B_FLAG));

    EXPECT_CALL(mmu, read_byte(kBrkAddress)).WillOnce(Return(0xAD));
    EXPECT_CALL(mmu, read_byte(kBrkAddress + 1)).WillOnce(Return(0xDE));

    step_execution(7);

    EXPECT_EQ(expected, registers);
}